

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_reader_init_internal(mz_zip_archive *pZip,mz_uint32 flags)

{
  long lVar1;
  undefined8 *in_RDI;
  mz_bool local_4;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RDI[0xb] != 0)) || (*(int *)((long)in_RDI + 0x14) != 0))
  {
    local_4 = 0;
  }
  else {
    if (in_RDI[4] == 0) {
      in_RDI[4] = def_alloc_func;
    }
    if (in_RDI[5] == 0) {
      in_RDI[5] = def_free_func;
    }
    if (in_RDI[6] == 0) {
      in_RDI[6] = def_realloc_func;
    }
    *(undefined4 *)((long)in_RDI + 0x14) = 1;
    *in_RDI = 0;
    in_RDI[1] = 0;
    *(undefined4 *)(in_RDI + 2) = 0;
    lVar1 = (*(code *)in_RDI[4])(in_RDI[7],1,0x80);
    in_RDI[0xb] = lVar1;
    if (lVar1 == 0) {
      local_4 = 0;
    }
    else {
      memset((void *)in_RDI[0xb],0,0x80);
      *(undefined4 *)(in_RDI[0xb] + 0x18) = 1;
      *(undefined4 *)(in_RDI[0xb] + 0x38) = 4;
      *(undefined4 *)(in_RDI[0xb] + 0x58) = 4;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static mz_bool mz_zip_reader_init_internal(mz_zip_archive *pZip, mz_uint32 flags)
{
  (void)flags;
  if ((!pZip) || (pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_INVALID))
    return MZ_FALSE;

  if (!pZip->m_pAlloc) pZip->m_pAlloc = def_alloc_func;
  if (!pZip->m_pFree) pZip->m_pFree = def_free_func;
  if (!pZip->m_pRealloc) pZip->m_pRealloc = def_realloc_func;

  pZip->m_zip_mode = MZ_ZIP_MODE_READING;
  pZip->m_archive_size = 0;
  pZip->m_central_directory_file_ofs = 0;
  pZip->m_total_files = 0;

  if (NULL == (pZip->m_pState = (mz_zip_internal_state *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(mz_zip_internal_state))))
    return MZ_FALSE;
  memset(pZip->m_pState, 0, sizeof(mz_zip_internal_state));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir, sizeof(mz_uint8));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir_offsets, sizeof(mz_uint32));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_sorted_central_dir_offsets, sizeof(mz_uint32));
  return MZ_TRUE;
}